

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O2

RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_> *
__thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::_balance
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,
          RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *node)

{
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar1;
  
  pRVar1 = node->_left;
  if ((node->_right !=
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0) && (node->_right->_is_red == true)) {
    if ((pRVar1 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                    *)0x0) && (pRVar1->_is_red == true)) {
      _flipColors(this,node);
      goto LAB_0010405c;
    }
    node = _leftRotate(this,node);
  }
  if (pRVar1 == (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 *)0x0) {
    return node;
  }
LAB_0010405c:
  if (((pRVar1->_left !=
        (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
         *)0x0) && (pRVar1->_is_red == true)) && (pRVar1->_left->_is_red == true)) {
    node = _rightRotate(this,node);
    _flipColors(this,node);
  }
  return node;
}

Assistant:

inline
    RBTreeNode<TreeElement<Key, Value>>* RBTree<Key, Value>::_balance(RBTreeNode<TreeElement<Key, Value>> *node){
        auto left = node->left();
        auto right = node->right();
        if (right != nullptr && right->isRed()) {
            if (left != nullptr && left->isRed()) {
                _flipColors(node);
            } else {
                node = _leftRotate(node);
            }
        }
        // if node is a 4-node
        if ((left != nullptr && left->left() != nullptr) && (left->isRed() && left->left()->isRed())) {
            node = _rightRotate(node);
            _flipColors(node);
        }
        return node;
    }